

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_close_outfile(mcpl_outfile_t of)

{
  if (*(int *)((long)of.internal + 0x60) != 0) {
    mcpl_write_header((mcpl_outfileinternal_t *)of.internal);
  }
  if (*(uint64_t *)((long)of.internal + 0x68) != 0) {
    mcpl_update_nparticles
              (*(FILE **)((long)of.internal + 8),*(uint64_t *)((long)of.internal + 0x68));
  }
  mcpl_internal_cleanup_outfile((mcpl_outfileinternal_t *)of.internal);
  return;
}

Assistant:

void mcpl_close_outfile(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  if (f->header_notwritten)
    mcpl_write_header(f);
  if (f->nparticles)
    mcpl_update_nparticles(f->file,f->nparticles);
  mcpl_internal_cleanup_outfile(f);
}